

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall cs::compile_error::~compile_error(compile_error *this)

{
  ~compile_error(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~compile_error() override = default;